

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.h
# Opt level: O0

void __thiscall Connection::onSocketError(Connection *this,SharedPtr *param_1,Error error)

{
  int *piVar1;
  enable_shared_from_this<Connection> local_c0;
  enable_shared_from_this<Connection> local_b0;
  String local_a0;
  Log local_70;
  Log local_60;
  Log local_50;
  String local_40;
  Error local_1c;
  SharedPtr *pSStack_18;
  Error error_local;
  SharedPtr *param_1_local;
  Connection *this_local;
  
  local_1c = error;
  pSStack_18 = param_1;
  param_1_local = (SharedPtr *)this;
  warning();
  Log::operator<<(&local_60,(char *)&local_70);
  Log::operator<<(&local_50,(int32_t)&local_60);
  __errno_location();
  Log::operator<<((Log *)&local_40,(int32_t)&local_50);
  piVar1 = __errno_location();
  Rct::strerror((Rct *)&local_a0,*piVar1);
  ::operator<<((Log *)&local_40.mString.field_2,&local_40);
  Log::~Log((Log *)&local_40.mString.field_2);
  String::~String(&local_a0);
  Log::~Log((Log *)&local_40);
  Log::~Log(&local_50);
  Log::~Log(&local_60);
  Log::~Log(&local_70);
  std::enable_shared_from_this<Connection>::shared_from_this(&local_b0);
  Signal<std::function<void(std::shared_ptr<Connection>)>>::operator()
            ((Signal<std::function<void(std::shared_ptr<Connection>)>> *)&this->mError,
             (shared_ptr<Connection> *)&local_b0);
  std::shared_ptr<Connection>::~shared_ptr((shared_ptr<Connection> *)&local_b0);
  std::enable_shared_from_this<Connection>::shared_from_this(&local_c0);
  Signal<std::function<void(std::shared_ptr<Connection>)>>::operator()
            ((Signal<std::function<void(std::shared_ptr<Connection>)>> *)&this->mDisconnected,
             (shared_ptr<Connection> *)&local_c0);
  std::shared_ptr<Connection>::~shared_ptr((shared_ptr<Connection> *)&local_c0);
  return;
}

Assistant:

void onSocketError(const SocketClient::SharedPtr&, SocketClient::Error error)
    {
        ::warning() << "Socket error" << error << errno << Rct::strerror();
        mError(shared_from_this());
        mDisconnected(shared_from_this());
    }